

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_avx2.c
# Opt level: O0

void av1_dr_prediction_z2_avx2
               (uint8_t *dst,ptrdiff_t stride,int bw,int bh,uint8_t *above,uint8_t *left,
               int upsample_above,int upsample_left,int dx,int dy)

{
  int in_EDX;
  int in_stack_00000010;
  int in_stack_00000018;
  int in_stack_00000020;
  int in_stack_000001a4;
  uint8_t *in_stack_000001a8;
  uint8_t *in_stack_000001b0;
  ptrdiff_t in_stack_000001b8;
  uint8_t *in_stack_000001c0;
  int in_stack_000001cc;
  int in_stack_00000254;
  uint8_t *in_stack_00000258;
  uint8_t *in_stack_00000260;
  ptrdiff_t in_stack_00000268;
  uint8_t *in_stack_00000270;
  int in_stack_0000027c;
  uint8_t *in_stack_00000498;
  uint8_t *in_stack_000004a0;
  ptrdiff_t in_stack_000004a8;
  uint8_t *in_stack_000004b0;
  int in_stack_000004b8;
  int in_stack_000004bc;
  int in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc8;
  
  if (in_EDX == 4) {
    dr_prediction_z2_Nx4_avx2
              (in_stack_000001cc,in_stack_000001c0,in_stack_000001b8,in_stack_000001b0,
               in_stack_000001a8,in_stack_000001a4,in_stack_00000018,in_stack_00000020,
               in_stack_ffffffffffffffc0);
  }
  else if (in_EDX == 8) {
    dr_prediction_z2_Nx8_avx2
              (in_stack_0000027c,in_stack_00000270,in_stack_00000268,in_stack_00000260,
               in_stack_00000258,in_stack_00000254,in_stack_00000018,in_stack_00000020,
               in_stack_ffffffffffffffc0);
  }
  else {
    dr_prediction_z2_HxW_avx2
              (in_stack_000004bc,in_stack_000004b8,in_stack_000004b0,in_stack_000004a8,
               in_stack_000004a0,in_stack_00000498,in_stack_00000010,in_stack_00000018,
               in_stack_00000020,in_stack_ffffffffffffffc8);
  }
  return;
}

Assistant:

void av1_dr_prediction_z2_avx2(uint8_t *dst, ptrdiff_t stride, int bw, int bh,
                               const uint8_t *above, const uint8_t *left,
                               int upsample_above, int upsample_left, int dx,
                               int dy) {
  assert(dx > 0);
  assert(dy > 0);
  switch (bw) {
    case 4:
      dr_prediction_z2_Nx4_avx2(bh, dst, stride, above, left, upsample_above,
                                upsample_left, dx, dy);
      break;
    case 8:
      dr_prediction_z2_Nx8_avx2(bh, dst, stride, above, left, upsample_above,
                                upsample_left, dx, dy);
      break;
    default:
      dr_prediction_z2_HxW_avx2(bh, bw, dst, stride, above, left,
                                upsample_above, upsample_left, dx, dy);
      break;
  }
  return;
}